

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

Point2f __thiscall
pbrt::PortalImageInfiniteLight::ImageFromRender
          (PortalImageInfiniteLight *this,Vector3f *wRender,Float *duv_dw)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Tuple2<pbrt::Point2,_float> TVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [60];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vector3f VVar19;
  float local_38;
  undefined1 extraout_var [60];
  
  auVar15 = in_ZMM1._4_60_;
  auVar13 = in_ZMM0._8_56_;
  VVar19 = Frame::ToLocal(&this->portalFrame,wRender);
  auVar14._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._4_60_ = auVar15;
  auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar13;
  uVar2 = vcmpss_avx512f(auVar14._0_16_,ZEXT816(0) << 0x40,0);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar10 = (float)((uint)bVar3 * 0x3727c5ac + (uint)!bVar3 * (int)auVar14._0_4_);
  auVar9 = auVar11._0_16_;
  if (duv_dw != (Float *)0x0) {
    auVar16._8_4_ = 0x3f800000;
    auVar16._0_8_ = 0x3f8000003f800000;
    auVar16._12_4_ = 0x3f800000;
    auVar16 = vfnmadd231ps_fma(auVar16,auVar9,auVar9);
    auVar8 = vmovshdup_avx(auVar16);
    auVar17._0_4_ = (auVar8._0_4_ * auVar16._0_4_) / fVar10;
    auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar17,auVar8);
    *duv_dw = auVar8._0_4_ * 9.869605;
  }
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(ZEXT416((uint)fVar10),auVar4);
  auVar9 = vmovshdup_avx(auVar9);
  fVar10 = atanf(VVar19.super_Tuple3<pbrt::Vector3,_float>.x / auVar8._0_4_);
  local_38 = auVar9._0_4_;
  auVar12._0_4_ = atanf(local_38 / auVar8._0_4_);
  auVar12._4_60_ = extraout_var;
  auVar6._4_4_ = extraout_XMM0_Db;
  auVar6._0_4_ = fVar10;
  auVar6._8_4_ = extraout_XMM0_Dc;
  auVar6._12_4_ = extraout_XMM0_Dd;
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  auVar9 = vinsertps_avx(auVar6,auVar12._0_16_,0x10);
  auVar5._8_4_ = 0x3fc90fdb;
  auVar5._0_8_ = 0x3fc90fdb3fc90fdb;
  auVar5._12_4_ = 0x3fc90fdb;
  auVar8 = vaddps_avx512vl(auVar9,auVar5);
  auVar9._8_4_ = 0x40490fdb;
  auVar9._0_8_ = 0x40490fdb40490fdb;
  auVar9._12_4_ = 0x40490fdb;
  auVar9 = vdivps_avx512vl(auVar8,auVar9);
  uVar1 = vcmpps_avx512vl(auVar9,ZEXT816(0) << 0x20,5);
  auVar9 = vminps_avx512vl(auVar18,auVar9);
  TVar7.y = (float)((uint)((byte)(uVar1 >> 1) & 1) * auVar9._4_4_);
  TVar7.x = (float)((uint)((byte)uVar1 & 1) * auVar9._0_4_);
  return (Point2f)TVar7;
}

Assistant:

PBRT_CPU_GPU
    Point2f ImageFromRender(const Vector3f &wRender, Float *duv_dw = nullptr) const {
        Vector3f w = portalFrame.ToLocal(wRender);
        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);

        Float alpha = std::atan(w.x / -w.z), beta = std::atan(w.y / -w.z);
        DCHECK(!IsNaN(alpha + beta));
        return Point2f(Clamp((alpha + Pi / 2) / Pi, 0, 1),
                       Clamp((beta + Pi / 2) / Pi, 0, 1));
    }